

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_loop_filter_alloc(AV1LfSync *lf_sync,AV1_COMMON *cm,int rows,int width,int num_workers)

{
  int iVar1;
  pthread_mutex_t *ppVar2;
  pthread_cond_t *ppVar3;
  LFWorkerData *pLVar4;
  int *piVar5;
  AV1LfMTInfo *pAVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int j;
  
  lf_sync->rows = rows;
  lVar7 = (long)rows;
  lVar9 = 0;
  do {
    ppVar2 = (pthread_mutex_t *)aom_malloc(lVar7 * 0x28);
    lf_sync->mutex_[lVar9] = ppVar2;
    if (ppVar2 == (pthread_mutex_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->mutex_[j]");
    }
    if (lf_sync->mutex_[lVar9] != (pthread_mutex_t *)0x0 && 0 < rows) {
      lVar8 = 0;
      do {
        pthread_mutex_init((pthread_mutex_t *)((long)lf_sync->mutex_[lVar9] + lVar8),
                           (pthread_mutexattr_t *)0x0);
        lVar8 = lVar8 + 0x28;
      } while ((ulong)(uint)rows * 0x28 != lVar8);
    }
    ppVar3 = (pthread_cond_t *)aom_malloc(lVar7 * 0x30);
    lf_sync->cond_[lVar9] = ppVar3;
    if (ppVar3 == (pthread_cond_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->cond_[j]");
    }
    if (lf_sync->cond_[lVar9] != (pthread_cond_t *)0x0 && 0 < rows) {
      lVar8 = 0;
      do {
        pthread_cond_init((pthread_cond_t *)((long)lf_sync->cond_[lVar9] + lVar8),
                          (pthread_condattr_t *)0x0);
        lVar8 = lVar8 + 0x30;
      } while ((ulong)(uint)rows * 0x30 != lVar8);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  ppVar2 = (pthread_mutex_t *)aom_malloc(0x28);
  lf_sync->job_mutex = ppVar2;
  if (ppVar2 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->job_mutex");
  }
  if (lf_sync->job_mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)lf_sync->job_mutex,(pthread_mutexattr_t *)0x0);
  }
  pLVar4 = (LFWorkerData *)aom_malloc((long)num_workers * 0x2268);
  lf_sync->lfdata = pLVar4;
  if (pLVar4 == (LFWorkerData *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->lfdata");
  }
  lf_sync->num_workers = num_workers;
  lVar9 = 0;
  do {
    piVar5 = (int *)aom_malloc(lVar7 * 4);
    lf_sync->cur_sb_col[lVar9] = piVar5;
    if (piVar5 == (int *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->cur_sb_col[j]");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  pAVar6 = (AV1LfMTInfo *)aom_malloc(lVar7 * 0x60);
  lf_sync->job_queue = pAVar6;
  if (pAVar6 == (AV1LfMTInfo *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lf_sync->job_queue");
  }
  iVar1 = 1;
  if ((0x27f < width) && (iVar1 = 2, 0x500 < width)) {
    iVar1 = (uint)(0x1000 < width) * 4 + 4;
  }
  lf_sync->sync_range = iVar1;
  return;
}

Assistant:

void av1_loop_filter_alloc(AV1LfSync *lf_sync, AV1_COMMON *cm, int rows,
                           int width, int num_workers) {
  lf_sync->rows = rows;
#if CONFIG_MULTITHREAD
  {
    int i, j;

    for (j = 0; j < MAX_MB_PLANE; j++) {
      CHECK_MEM_ERROR(cm, lf_sync->mutex_[j],
                      aom_malloc(sizeof(*(lf_sync->mutex_[j])) * rows));
      if (lf_sync->mutex_[j]) {
        for (i = 0; i < rows; ++i) {
          pthread_mutex_init(&lf_sync->mutex_[j][i], NULL);
        }
      }

      CHECK_MEM_ERROR(cm, lf_sync->cond_[j],
                      aom_malloc(sizeof(*(lf_sync->cond_[j])) * rows));
      if (lf_sync->cond_[j]) {
        for (i = 0; i < rows; ++i) {
          pthread_cond_init(&lf_sync->cond_[j][i], NULL);
        }
      }
    }

    CHECK_MEM_ERROR(cm, lf_sync->job_mutex,
                    aom_malloc(sizeof(*(lf_sync->job_mutex))));
    if (lf_sync->job_mutex) {
      pthread_mutex_init(lf_sync->job_mutex, NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD
  CHECK_MEM_ERROR(cm, lf_sync->lfdata,
                  aom_malloc(num_workers * sizeof(*(lf_sync->lfdata))));
  lf_sync->num_workers = num_workers;

  for (int j = 0; j < MAX_MB_PLANE; j++) {
    CHECK_MEM_ERROR(cm, lf_sync->cur_sb_col[j],
                    aom_malloc(sizeof(*(lf_sync->cur_sb_col[j])) * rows));
  }
  CHECK_MEM_ERROR(
      cm, lf_sync->job_queue,
      aom_malloc(sizeof(*(lf_sync->job_queue)) * rows * MAX_MB_PLANE * 2));
  // Set up nsync.
  lf_sync->sync_range = get_sync_range(width);
}